

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O2

void ot::commissioner::persistent_storage::from_json(json *aJson,Registrar *aValue)

{
  uint uVar1;
  const_reference pvVar2;
  
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  uVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_int,_unsigned_int,_0>(pvVar2);
  (aValue->mId).mId = uVar1;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ADDR_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar2,&aValue->mAddr);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_PORT_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
            (pvVar2,&aValue->mPort);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_DOMAINS_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (pvVar2,&aValue->mDomains);
  return;
}

Assistant:

void from_json(const json &aJson, Registrar &aValue)
{
    aJson.at(JSON_ID).get_to(aValue.mId);
    aJson.at(JSON_ADDR).get_to(aValue.mAddr);
    aJson.at(JSON_PORT).get_to(aValue.mPort);
    aJson.at(JSON_DOMAINS).get_to(aValue.mDomains);
}